

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

int __thiscall Cmd::enableRawMode(Cmd *this,int fd)

{
  termios *__termios_p;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  termios local_68;
  
  iVar7 = 0;
  if (this->raw_mode_ == false) {
    iVar6 = isatty(this->in_fd_);
    iVar7 = -0x19;
    if (iVar6 != 0) {
      __termios_p = &this->orig_termios_;
      iVar6 = tcgetattr(fd,(termios *)__termios_p);
      if (iVar6 != -1) {
        uVar5._0_4_ = __termios_p->c_iflag;
        uVar5._4_4_ = __termios_p->c_oflag;
        uVar1 = (this->orig_termios_).c_cflag;
        uVar2 = (this->orig_termios_).c_lflag;
        uVar3._0_1_ = (this->orig_termios_).c_line;
        uVar3._1_1_ = (this->orig_termios_).c_cc[0];
        uVar3._2_1_ = (this->orig_termios_).c_cc[1];
        uVar3._3_1_ = (this->orig_termios_).c_cc[2];
        uVar3._4_1_ = (this->orig_termios_).c_cc[3];
        uVar3._5_1_ = (this->orig_termios_).c_cc[4];
        uVar3._6_1_ = (this->orig_termios_).c_cc[5];
        uVar3._7_1_ = (this->orig_termios_).c_cc[6];
        local_68.c_cc._7_8_ = *(undefined8 *)((this->orig_termios_).c_cc + 7);
        local_68.c_cc._15_8_ = *(undefined8 *)((this->orig_termios_).c_cc + 0xf);
        uVar4 = *(undefined8 *)((this->orig_termios_).c_cc + 0x17);
        local_68.c_ispeed = (this->orig_termios_).c_ispeed;
        local_68.c_ospeed = (this->orig_termios_).c_ospeed;
        local_68._48_4_ = SUB84((ulong)*(undefined8 *)((this->orig_termios_).c_cc + 0x1b) >> 0x20,0)
        ;
        local_68.c_cc._23_4_ = SUB84(uVar4,0);
        local_68.c_cc._27_4_ = SUB84((ulong)uVar4 >> 0x20,0);
        local_68._0_8_ = uVar5 & 0xfffffffefffffacd;
        uVar5 = CONCAT44(uVar2,uVar1 | DAT_00106020._8_4_);
        local_68._8_8_ = uVar5 & 0xffff7ff4ffffffff;
        local_68._16_6_ = SUB86(uVar3,0);
        local_68.c_cc._5_2_ = 0x100;
        iVar7 = tcsetattr(fd,2,&local_68);
        if (iVar7 < 0) {
          iVar7 = -0x19;
        }
        else {
          this->raw_mode_ = true;
          iVar7 = 0;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int enableRawMode(int fd) {

		if (raw_mode_) {
			return 0;
		}

		if (!isatty(in_fd_)) {
			return -ENOTTY;
		}

		if (tcgetattr(fd, &orig_termios_) == -1) {
			return -ENOTTY;
		}

		struct termios raw = orig_termios_; // modify the original mode

		// input modes: no break, no CR to NL, no parity check, no strip char, no start/stop output control.
		raw.c_iflag &= ~(BRKINT | ICRNL | INPCK | ISTRIP | IXON);
		// output modes - disable post processing
		raw.c_oflag &= ~(OPOST);
		// control modes - set 8 bit chars
		raw.c_cflag |= (CS8);
		// local modes - echoing off, canonical off, no extended functions, no signal chars (^Z,^C)
		raw.c_lflag &= ~(ECHO | ICANON | IEXTEN | ISIG);
		// control chars - set return condition: min number of bytes and timer. We want read to return every single byte, without timeout.
		raw.c_cc[VMIN]  = 1;
		raw.c_cc[VTIME] = 0; // 1 byte, no timer

		// put terminal in raw mode after flushing
		if (tcsetattr(fd, TCSAFLUSH, &raw) < 0)
			return -ENOTTY;

		raw_mode_ = true;
		return 0;
	}